

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genbrk.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int32_t iVar2;
  uint32_t uVar3;
  FILE *pFVar4;
  size_t __n;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  UConverter *cnv;
  undefined4 extraout_var;
  UChar *dest;
  RuleBasedBreakIterator *this;
  undefined4 extraout_var_00;
  UNewDataMemory *pData;
  char *pcVar8;
  size_t size;
  char *pcVar9;
  UErrorCode UVar10;
  ulong uVar11;
  long lVar12;
  UErrorCode local_104;
  uint32_t outDataSize;
  int32_t signatureLength;
  ConstChar16Ptr local_f8;
  char *local_f0;
  undefined8 local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  UChar *local_c8;
  UnicodeString ruleSourceS;
  UParseError parseError;
  
  progName = *argv;
  iVar1 = u_parseArgs(argc,argv,9,options);
  pcVar9 = options[4].value;
  pcVar7 = options[3].value;
  if (iVar1 < 0) {
    fprintf(_stderr,"error in command line argument \"%s\"\n",argv[(uint)-iVar1]);
LAB_001539ff:
    UVar10 = U_ILLEGAL_ARGUMENT_ERROR;
    usageAndDie(1);
  }
  else {
    if (options[1].doesOccur != '\0' || options[0].doesOccur != '\0') {
      usageAndDie(0);
LAB_001539e3:
      fwrite("rule file and output file must both be specified.\n",0x32,1,_stderr);
      goto LAB_001539ff;
    }
    if ((options[3].doesOccur == '\0') || (options[4].doesOccur == '\0')) goto LAB_001539e3;
    if (options[5].doesOccur != '\0') {
      u_setDataDirectory_63(options[5].value);
    }
    local_104 = U_ZERO_ERROR;
    pcVar5 = (char *)0x0;
    if (options[6].doesOccur != '\0') {
      pcVar5 = options[6].value;
    }
    pcVar8 = 
    " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
    ;
    if (options[7].doesOccur == '\0') {
      pcVar8 = (char *)0x0;
    }
    u_init_63(&local_104);
    UVar10 = local_104;
    if (local_104 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_104 = U_ZERO_ERROR;
      local_e0 = pcVar8;
      local_d8 = pcVar5;
      pFVar4 = fopen(pcVar7,"rb");
      if (pFVar4 == (FILE *)0x0) {
        pcVar9 = "Could not open file \"%s\"\n";
LAB_00153b1a:
        fprintf(_stderr,pcVar9,pcVar7);
        exit(-1);
      }
      fseek(pFVar4,0,2);
      __n = ftell(pFVar4);
      fseek(pFVar4,0,0);
      uVar11 = 0xffffffffffffffff;
      if (-0xb < (long)__n) {
        uVar11 = __n + 10;
      }
      pcVar5 = (char *)operator_new__(uVar11);
      sVar6 = fread(pcVar5,1,__n,pFVar4);
      if (sVar6 != __n) {
        pcVar9 = "Error reading file \"%s\"\n";
        goto LAB_00153b1a;
      }
      local_d0 = pcVar9;
      pcVar5[__n] = '\0';
      fclose(pFVar4);
      pcVar7 = ucnv_detectUnicodeSignature_63(pcVar5,(int)__n,&signatureLength,&local_104);
      UVar10 = local_104;
      if (local_104 < U_ILLEGAL_ARGUMENT_ERROR) {
        lVar12 = (long)signatureLength;
        if (pcVar7 == (char *)0x0) {
          lVar12 = 0;
        }
        cnv = ucnv_open_63(pcVar7,&local_104);
        pFVar4 = _stderr;
        if (local_104 < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar1 = (int)__n - (int)lVar12;
          local_f0 = pcVar5;
          iVar2 = ucnv_toUChars_63(cnv,(UChar *)0x0,0,pcVar5 + lVar12,iVar1,&local_104);
          if (local_104 == U_BUFFER_OVERFLOW_ERROR) {
            local_104 = U_ZERO_ERROR;
            local_e8 = CONCAT44(extraout_var,iVar2);
            dest = (UChar *)operator_new__((ulong)(iVar2 + 1U) * 2);
            ucnv_toUChars_63(cnv,dest,iVar2 + 1U,pcVar5 + lVar12,iVar1,&local_104);
            if (local_104 < U_ILLEGAL_ARGUMENT_ERROR) {
              ucnv_close_63(cnv);
              size = 0;
              local_f8.p_ = dest;
              icu_63::UnicodeString::UnicodeString(&ruleSourceS,'\0',&local_f8,(int32_t)local_e8);
              pcVar7 = local_d0;
              local_c8 = local_f8.p_;
              parseError.line = 0;
              parseError.offset = 0;
              this = (RuleBasedBreakIterator *)icu_63::UMemory::operator_new((UMemory *)0x280,size);
              if (this != (RuleBasedBreakIterator *)0x0) {
                icu_63::RuleBasedBreakIterator::RuleBasedBreakIterator
                          (this,&ruleSourceS,&parseError,&local_104);
              }
              pFVar4 = _stderr;
              if (local_104 < U_ILLEGAL_ARGUMENT_ERROR) {
                iVar1 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0x19])(this);
                dh.info.formatVersion =
                     *(uint8_t (*) [4])((long)CONCAT44(extraout_var_00,iVar1) + 4);
                pData = udata_create(local_d8,(char *)0x0,pcVar7,&dh.info,local_e0,&local_104);
                pFVar4 = _stderr;
                if (local_104 < U_ILLEGAL_ARGUMENT_ERROR) {
                  udata_writeBlock(pData,(void *)CONCAT44(extraout_var_00,iVar1),outDataSize);
                  uVar3 = udata_finish(pData,&local_104);
                  if (local_104 < U_ILLEGAL_ARGUMENT_ERROR) {
                    if (uVar3 == outDataSize) {
                      (*(this->super_BreakIterator).super_UObject._vptr_UObject[1])(this);
                      operator_delete__(dest);
                      operator_delete__(local_f0);
                      u_cleanup_63();
                      if (options[8].doesOccur == '\0') {
                        puts("genbrk: tool completed successfully.");
                      }
                      icu_63::UnicodeString::~UnicodeString(&ruleSourceS);
                      return 0;
                    }
                    pcVar9 = "Error writing to output file \"%s\"\n";
                    goto LAB_00153b1a;
                  }
                  fprintf(_stderr,"genbrk: error %d writing the output file\n");
                }
                else {
                  pcVar9 = u_errorName_63(local_104);
                  fprintf(pFVar4,"genbrk: Could not open output file \"%s\", \"%s\"\n",pcVar7,pcVar9
                         );
                }
              }
              else {
                pcVar7 = u_errorName_63(local_104);
                fprintf(pFVar4,
                        "createRuleBasedBreakIterator: ICU Error \"%s\"  at line %d, column %d\n",
                        pcVar7,parseError._0_8_ & 0xffffffff,(ulong)parseError._0_8_ >> 0x20);
              }
              goto LAB_00153afd;
            }
          }
          pFVar4 = _stderr;
          pcVar7 = u_errorName_63(local_104);
          pcVar9 = "ucnv_toUChars: ICU Error \"%s\"\n";
        }
        else {
          pcVar7 = u_errorName_63(local_104);
          pcVar9 = "ucnv_open: ICU Error \"%s\"\n";
        }
        fprintf(pFVar4,pcVar9,pcVar7);
LAB_00153afd:
        exit(local_104);
      }
      goto LAB_00153a33;
    }
  }
  pFVar4 = _stderr;
  pcVar7 = *argv;
  pcVar9 = u_errorName_63(UVar10);
  fprintf(pFVar4,"%s: can not initialize ICU.  status = %s\n",pcVar7,pcVar9);
  UVar10 = U_ILLEGAL_ARGUMENT_ERROR;
LAB_00153a33:
  exit(UVar10);
}

Assistant:

int  main(int argc, char **argv) {
    UErrorCode  status = U_ZERO_ERROR;
    const char *ruleFileName;
    const char *outFileName;
    const char *outDir = NULL;
    const char *copyright = NULL;

    //
    // Pick up and check the command line arguments,
    //    using the standard ICU tool utils option handling.
    //
    U_MAIN_INIT_ARGS(argc, argv);
    progName = argv[0];
    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);
    if(argc<0) {
        // Unrecognized option
        fprintf(stderr, "error in command line argument \"%s\"\n", argv[-argc]);
        usageAndDie(U_ILLEGAL_ARGUMENT_ERROR);
    }

    if(options[0].doesOccur || options[1].doesOccur) {
        //  -? or -h for help.
        usageAndDie(0);
    }

    if (!(options[3].doesOccur && options[4].doesOccur)) {
        fprintf(stderr, "rule file and output file must both be specified.\n");
        usageAndDie(U_ILLEGAL_ARGUMENT_ERROR);
    }
    ruleFileName = options[3].value;
    outFileName  = options[4].value;

    if (options[5].doesOccur) {
        u_setDataDirectory(options[5].value);
    }

    status = U_ZERO_ERROR;

    /* Combine the directory with the file name */
    if(options[6].doesOccur) {
        outDir = options[6].value;
    }
    if (options[7].doesOccur) {
        copyright = U_COPYRIGHT_STRING;
    }

#if UCONFIG_NO_BREAK_ITERATION || UCONFIG_NO_FILE_IO

    UNewDataMemory *pData;
    char msg[1024];

    /* write message with just the name */
    sprintf(msg, "genbrk writes dummy %s because of UCONFIG_NO_BREAK_ITERATION and/or UCONFIG_NO_FILE_IO, see uconfig.h", outFileName);
    fprintf(stderr, "%s\n", msg);

    /* write the dummy data file */
    pData = udata_create(outDir, NULL, outFileName, &dummyDataInfo, NULL, &status);
    udata_writeBlock(pData, msg, strlen(msg));
    udata_finish(pData, &status);
    return (int)status;

#else
    /* Initialize ICU */
    u_init(&status);
    if (U_FAILURE(status)) {
        fprintf(stderr, "%s: can not initialize ICU.  status = %s\n",
            argv[0], u_errorName(status));
        exit(1);
    }
    status = U_ZERO_ERROR;

    //
    //  Read in the rule source file
    //
    long        result;
    long        ruleFileSize;
    FILE        *file;
    char        *ruleBufferC;

    file = fopen(ruleFileName, "rb");
    if( file == 0 ) {
        fprintf(stderr, "Could not open file \"%s\"\n", ruleFileName);
        exit(-1);
    }
    fseek(file, 0, SEEK_END);
    ruleFileSize = ftell(file);
    fseek(file, 0, SEEK_SET);
    ruleBufferC = new char[ruleFileSize+10];

    result = (long)fread(ruleBufferC, 1, ruleFileSize, file);
    if (result != ruleFileSize)  {
        fprintf(stderr, "Error reading file \"%s\"\n", ruleFileName);
        exit (-1);
    }
    ruleBufferC[ruleFileSize]=0;
    fclose(file);

    //
    // Look for a Unicode Signature (BOM) on the rule file
    //
    int32_t        signatureLength;
    const char *   ruleSourceC = ruleBufferC;
    const char*    encoding = ucnv_detectUnicodeSignature(
                           ruleSourceC, ruleFileSize, &signatureLength, &status);
    if (U_FAILURE(status)) {
        exit(status);
    }
    if(encoding!=NULL ){
        ruleSourceC  += signatureLength;
        ruleFileSize -= signatureLength;
    }

    //
    // Open a converter to take the rule file to UTF-16
    //
    UConverter* conv;
    conv = ucnv_open(encoding, &status);
    if (U_FAILURE(status)) {
        fprintf(stderr, "ucnv_open: ICU Error \"%s\"\n", u_errorName(status));
        exit(status);
    }

    //
    // Convert the rules to UChar.
    //  Preflight first to determine required buffer size.
    //
    uint32_t destCap = ucnv_toUChars(conv,
                       NULL,           //  dest,
                       0,              //  destCapacity,
                       ruleSourceC,
                       ruleFileSize,
                       &status);
    if (status != U_BUFFER_OVERFLOW_ERROR) {
        fprintf(stderr, "ucnv_toUChars: ICU Error \"%s\"\n", u_errorName(status));
        exit(status);
    };

    status = U_ZERO_ERROR;
    UChar *ruleSourceU = new UChar[destCap+1];
    ucnv_toUChars(conv,
                  ruleSourceU,     //  dest,
                  destCap+1,
                  ruleSourceC,
                  ruleFileSize,
                  &status);
    if (U_FAILURE(status)) {
        fprintf(stderr, "ucnv_toUChars: ICU Error \"%s\"\n", u_errorName(status));
        exit(status);
    };
    ucnv_close(conv);


    //
    //  Put the source rules into a UnicodeString
    //
    UnicodeString ruleSourceS(FALSE, ruleSourceU, destCap);

    //
    //  Create the break iterator from the rules
    //     This will compile the rules.
    //
    UParseError parseError;
    parseError.line = 0;
    parseError.offset = 0;
    RuleBasedBreakIterator *bi = new RuleBasedBreakIterator(ruleSourceS, parseError, status);
    if (U_FAILURE(status)) {
        fprintf(stderr, "createRuleBasedBreakIterator: ICU Error \"%s\"  at line %d, column %d\n",
                u_errorName(status), (int)parseError.line, (int)parseError.offset);
        exit(status);
    };


    //
    //  Get the compiled rule data from the break iterator.
    //
    uint32_t        outDataSize;
    const uint8_t  *outData;
    outData = bi->getBinaryRules(outDataSize);

    // Copy the data format version numbers from the RBBI data header into the UDataMemory header.
    uprv_memcpy(dh.info.formatVersion, ((RBBIDataHeader *)outData)->fFormatVersion, sizeof(dh.info.formatVersion));

    //
    //  Create the output file
    //
    size_t bytesWritten;
    UNewDataMemory *pData;
    pData = udata_create(outDir, NULL, outFileName, &(dh.info), copyright, &status);
    if(U_FAILURE(status)) {
        fprintf(stderr, "genbrk: Could not open output file \"%s\", \"%s\"\n", 
                         outFileName, u_errorName(status));
        exit(status);
    }


    //  Write the data itself.
    udata_writeBlock(pData, outData, outDataSize);
    // finish up 
    bytesWritten = udata_finish(pData, &status);
    if(U_FAILURE(status)) {
        fprintf(stderr, "genbrk: error %d writing the output file\n", status);
        exit(status);
    }
    
    if (bytesWritten != outDataSize) {
        fprintf(stderr, "Error writing to output file \"%s\"\n", outFileName);
        exit(-1);
    }

    delete bi;
    delete[] ruleSourceU;
    delete[] ruleBufferC;
    u_cleanup();


    if(!options[8].doesOccur) {
        printf("genbrk: tool completed successfully.\n");
    }
    return 0;

#endif /* #if !UCONFIG_NO_BREAK_ITERATION */
}